

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Magazine.cpp
# Opt level: O1

void __thiscall Magazine::printProperties(Magazine *this)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Magazine Type: ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->type)._M_dataplus._M_p,
                      (this->type)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Magazine Issue: ",0x10);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->Issue);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Magazine::printProperties() {
	cout << "Magazine Type: " << type << endl;
	cout << "Magazine Issue: " << Issue << endl;
}